

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcEdgeCurve::IfcEdgeCurve(IfcEdgeCurve *this)

{
  *(undefined ***)&this->field_0x78 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x80 = 0;
  *(char **)&this->field_0x88 = "IfcEdgeCurve";
  IfcEdge::IfcEdge(&this->super_IfcEdge,&PTR_construction_vtable_24__0077a7e0);
  *(undefined8 *)&(this->super_IfcEdge).field_0x48 = 0;
  *(undefined8 *)&(this->super_IfcEdge).field_0x50 = 0;
  (this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x77a728;
  *(undefined8 *)&this->field_0x78 = 0x77a7c8;
  *(undefined8 *)
   &(this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x77a750;
  *(undefined8 *)
   &(this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x77a778;
  *(undefined8 *)&(this->super_IfcEdge).field_0x40 = 0x77a7a0;
  (this->SameSense)._M_dataplus._M_p = (pointer)&(this->SameSense).field_2;
  (this->SameSense)._M_string_length = 0;
  (this->SameSense).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

IfcEdgeCurve() : Object("IfcEdgeCurve") {}